

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  ClassLabelsCase CVar3;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  TreeEnsembleParameters *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  TreeEnsembleClassifier *local_18;
  TreeEnsembleClassifier *from_local;
  TreeEnsembleClassifier *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x5bc);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = _internal_has_treeensemble(local_18);
  if (bVar1) {
    this_00 = _internal_mutable_treeensemble(this);
    from_00 = _internal_treeensemble(local_18);
    TreeEnsembleParameters::MergeFrom(this_00,from_00);
  }
  TVar2 = _internal_postevaluationtransform(local_18);
  if (TVar2 != NoTransform) {
    TVar2 = _internal_postevaluationtransform(local_18);
    _internal_set_postevaluationtransform(this,TVar2);
  }
  CVar3 = ClassLabels_case(local_18);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      this_01 = _internal_mutable_stringclasslabels(this);
      from_01 = _internal_stringclasslabels(local_18);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar3 == kInt64ClassLabels) {
      this_02 = _internal_mutable_int64classlabels(this);
      from_02 = _internal_int64classlabels(local_18);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_treeensemble()) {
    _internal_mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from._internal_treeensemble());
  }
  if (from._internal_postevaluationtransform() != 0) {
    _internal_set_postevaluationtransform(from._internal_postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}